

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void req0_ctx_cancel_recv(nni_aio *aio,void *arg,int rv)

{
  long lVar1;
  req0_sock *s;
  req0_ctx *ctx;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  lVar1 = *arg;
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x358));
  if (*(long *)((long)arg + 0x58) != 0) {
    nni_aio_set_msg(*(nni_aio **)((long)arg + 0x58),*(nni_msg **)((long)arg + 0x60));
    nni_msg_header_clear(*(nni_msg **)((long)arg + 0x60));
    *(undefined8 *)((long)arg + 0x60) = 0;
    nni_aio_finish_error(*(nni_aio **)((long)arg + 0x58),NNG_ECANCELED);
    *(undefined8 *)((long)arg + 0x58) = 0;
    nni_list_remove((nni_list *)(lVar1 + 0x100),arg);
  }
  if (*(nni_aio **)((long)arg + 0x50) == aio) {
    *(undefined8 *)((long)arg + 0x50) = 0;
    req0_ctx_reset((req0_ctx *)arg);
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
  return;
}

Assistant:

static void
req0_ctx_cancel_recv(nni_aio *aio, void *arg, int rv)
{
	req0_ctx  *ctx = arg;
	req0_sock *s   = ctx->sock;

	nni_mtx_lock(&s->mtx);

	// So it turns out that some users start receiving before waiting
	// for the send notification.  In this case if receiving is
	// canceled before sending completes, we need to restore the
	// message for the user.  It's probably a mis-design if the user
	// is trying to receive without waiting for sending to complete, but
	// it was reported in the field.  Users who want to avoid this mess
	// should just start receiving from the send completion callback.
	if (ctx->send_aio != NULL) {
		nni_aio_set_msg(ctx->send_aio, ctx->req_msg);
		nni_msg_header_clear(ctx->req_msg);
		ctx->req_msg = NULL;
		nni_aio_finish_error(ctx->send_aio, NNG_ECANCELED);
		ctx->send_aio = NULL;
		nni_list_remove(&s->send_queue, ctx);
	}

	if (ctx->recv_aio == aio) {
		ctx->recv_aio = NULL;

		// Cancellation of a pending receive is treated as aborting the
		// entire state machine.  This allows us to preserve the
		// semantic of exactly one receive operation per send
		// operation, and should be the least surprising for users. The
		// main consequence is that if the operation is completed
		// (in error or otherwise), the user must submit a new send
		// operation to restart the state machine.
		req0_ctx_reset(ctx);

		nni_aio_finish_error(aio, rv);
	}

	nni_mtx_unlock(&s->mtx);
}